

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

void boost::ext::di::v1_3_0::core::binder::
     resolve<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<impl1,std::default_delete<i1>>>&&,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<impl1,std::default_delete<i1>>>,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<i1,std::default_delete<i1>>,std::unique_ptr<impl1,std::default_delete<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<must_be_bound,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,dou___:core::array<i1,i1,impl1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
               (injector<must_be_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,_double>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<float>,_std::initializer_list<float>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<int>,_boost::ext::di::v1_3_0::core::array<int,_int,_int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_impl1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<i1>,_boost::ext::di::v1_3_0::core::array<i1,_i1,_impl1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                *deps)

{
  injector<must_be_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,_double>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<float>,_std::initializer_list<float>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<int>,_boost::ext::di::v1_3_0::core::array<int,_int,_int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_impl1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<i1>,_boost::ext::di::v1_3_0::core::array<i1,_i1,_impl1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_stack_ffffffffffffffe8;
  
  resolve_<boost::ext::di::v1_3_0::core::injector<must_be_bound,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,double>,boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::core::array<float>,std::initializer_list<float>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<int>,boost::ext::di::v1_3_0::core::array<int,int,int>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost___,std::default_delete<i1>>>_boost__ext__di__v1_3_0__no_name_void_boost__ext__di__v1_3_0__core__none>>
            (in_stack_ffffffffffffffe8,
             (type<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<i1,_std::default_delete<i1>_>,_std::unique_ptr<i1,_std::default_delete<i1>_>,_std::unique_ptr<impl1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<i1,_std::default_delete<i1>_>,_std::unique_ptr<i1,_std::default_delete<i1>_>,_std::unique_ptr<impl1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)0x10c558);
  return;
}

Assistant:

static decltype(auto) resolve(TDeps* deps) noexcept {
    using dependency = dependency_concept<aux::decay_t<T>, TName>;
#if (defined(__CLANG__) && __CLANG__ >= 3'9)  //
    return resolve_(deps, aux::type<decltype(resolve_impl<TDefault, dependency>(aux::declval<TDeps*>()))>{});
#else
    return resolve_impl<TDefault, dependency>(deps);
#endif
  }